

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

type __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator[]<double>
          (Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,key_type *key)

{
  unsigned_long uVar1;
  InsertionState IVar2;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
  pVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  local_40;
  
  pVar3 = Table<true,80ul,std::__cxx11::string,double,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::insertKeyPrepareEmptySpot<std::__cxx11::string_const&>
                    ((Table<true,80ul,std::__cxx11::string,double,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)this,key);
  uVar1 = pVar3.first;
  IVar2 = pVar3.second;
  if (IVar2 == overflow_error) {
    throwOverflowError(this);
  }
  else if (IVar2 == overwrite_node) {
    pair<std::__cxx11::string,double>::pair<std::__cxx11::string_const&>
              ((pair<std::__cxx11::string,double> *)&local_40);
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>::
    operator=(&this->mKeyVals[uVar1].mData,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else if (IVar2 == new_node) {
    local_40.first._M_dataplus._M_p = (pointer)key;
    pair<std::__cxx11::string,double>::pair<std::__cxx11::string_const&>
              ((pair<std::__cxx11::string,double> *)(this->mKeyVals + uVar1));
  }
  return &this->mKeyVals[uVar1].mData.second;
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type operator[](const key_type& key) {
        ROBIN_HOOD_TRACE(this)
        auto idxAndState = insertKeyPrepareEmptySpot(key);
        switch (idxAndState.second) {
        case InsertionState::key_found:
            break;

        case InsertionState::new_node:
            ::new (static_cast<void*>(&mKeyVals[idxAndState.first]))
                Node(*this, std::piecewise_construct, std::forward_as_tuple(key),
                     std::forward_as_tuple());
            break;

        case InsertionState::overwrite_node:
            mKeyVals[idxAndState.first] = Node(*this, std::piecewise_construct,
                                               std::forward_as_tuple(key), std::forward_as_tuple());
            break;

        case InsertionState::overflow_error:
            throwOverflowError();
        }

        return mKeyVals[idxAndState.first].getSecond();
    }